

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathHasSameNodes(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val;
  xmlNodeSetPtr val_00;
  int local_34;
  int n_nodes2;
  xmlNodeSetPtr nodes2;
  int n_nodes1;
  xmlNodeSetPtr nodes1;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (nodes2._4_4_ = 0; (int)nodes2._4_4_ < 1; nodes2._4_4_ = nodes2._4_4_ + 1) {
    for (local_34 = 0; local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlNodeSetPtr(nodes2._4_4_,0);
      val_00 = gen_xmlNodeSetPtr(local_34,1);
      iVar2 = xmlXPathHasSameNodes(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlNodeSetPtr(nodes2._4_4_,val,0);
      des_xmlNodeSetPtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathHasSameNodes",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)nodes2._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlXPathHasSameNodes(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    int ret_val;
    xmlNodeSetPtr nodes1; /* a node-set */
    int n_nodes1;
    xmlNodeSetPtr nodes2; /* a node-set */
    int n_nodes2;

    for (n_nodes1 = 0;n_nodes1 < gen_nb_xmlNodeSetPtr;n_nodes1++) {
    for (n_nodes2 = 0;n_nodes2 < gen_nb_xmlNodeSetPtr;n_nodes2++) {
        mem_base = xmlMemBlocks();
        nodes1 = gen_xmlNodeSetPtr(n_nodes1, 0);
        nodes2 = gen_xmlNodeSetPtr(n_nodes2, 1);

        ret_val = xmlXPathHasSameNodes(nodes1, nodes2);
        desret_int(ret_val);
        call_tests++;
        des_xmlNodeSetPtr(n_nodes1, nodes1, 0);
        des_xmlNodeSetPtr(n_nodes2, nodes2, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathHasSameNodes",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_nodes1);
            printf(" %d", n_nodes2);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}